

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::AcesInputFile::Data::initColorConversion(Data *this)

{
  float a;
  float f;
  bool bVar1;
  V2f *v;
  Box2i *pBVar2;
  float *pfVar3;
  Chromaticities *in_RDI;
  M44f bradfordTrans;
  M44f ratioMat;
  V3f ratio;
  V3f acesNeutralXYZ;
  float ay;
  float ax;
  V3f fileNeutralXYZ;
  float fy;
  float fx;
  V2f acesNeutral;
  Chromaticities acesChr;
  V2f fileNeutral;
  Chromaticities fileChr;
  Header *header;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  float k;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  float Y;
  float in_stack_fffffffffffffda4;
  Chromaticities *in_stack_fffffffffffffda8;
  Matrix44<float> local_1cc [3];
  Matrix44<float> local_10c;
  Vec3<float> local_b4;
  Vec3<float> local_a8;
  float local_9c;
  float local_98;
  Vec3<float> local_94;
  float local_88;
  float local_84;
  Vec2<float> local_80;
  Vec2<float> local_78;
  Vec2<float> VStack_70;
  Vec2<float> VStack_68;
  Vec2<float> VStack_60;
  Vec2<float> local_58;
  Vec2<float> local_50;
  Vec2<float> local_48;
  Vec2<float> local_40;
  Vec2<float> local_38;
  Vec2<float> local_30;
  Vec2<float> VStack_28;
  Vec2<float> VStack_20;
  Vec2<float> VStack_18;
  Header *local_10;
  
  local_10 = RgbaInputFile::header((RgbaInputFile *)0x16bcd4);
  Imath_3_2::Vec2<float>::Vec2(&local_38,0.64,0.33);
  Imath_3_2::Vec2<float>::Vec2(&local_40,0.3,0.6);
  Imath_3_2::Vec2<float>::Vec2(&local_48,0.15,0.06);
  Imath_3_2::Vec2<float>::Vec2(&local_50,0.3127,0.329);
  Chromaticities::Chromaticities
            ((Chromaticities *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             (V2f *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (V2f *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (V2f *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (V2f *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  bVar1 = hasChromaticities((Header *)0x16bd8a);
  if (bVar1) {
    chromaticities((Header *)0x16bd9d);
    Chromaticities::operator=
              ((Chromaticities *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               (Chromaticities *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  }
  Imath_3_2::Vec2<float>::Vec2(&local_58,&VStack_18);
  bVar1 = hasAdoptedNeutral((Header *)0x16bdd3);
  if (bVar1) {
    v = adoptedNeutral((Header *)0x16bde6);
    Imath_3_2::Vec2<float>::operator=(&local_58,v);
    Imath_3_2::Vec2<float>::operator=(&VStack_18,&local_58);
  }
  acesChromaticities();
  Chromaticities::Chromaticities
            ((Chromaticities *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (Chromaticities *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  Imath_3_2::Vec2<float>::Vec2(&local_80,&VStack_60);
  bVar1 = Imath_3_2::Vec2<float>::operator==(&local_30,&local_78);
  if ((((!bVar1) || (bVar1 = Imath_3_2::Vec2<float>::operator==(&VStack_28,&VStack_70), !bVar1)) ||
      (bVar1 = Imath_3_2::Vec2<float>::operator==(&VStack_20,&VStack_68), !bVar1)) ||
     (bVar1 = Imath_3_2::Vec2<float>::operator==(&VStack_18,&VStack_60), !bVar1)) {
    *(undefined1 *)&in_RDI[1].green.x = 1;
    pBVar2 = Header::dataWindow((Header *)0x16bedc);
    in_RDI[1].red.x = (float)(pBVar2->min).x;
    pBVar2 = Header::dataWindow((Header *)0x16bef6);
    in_RDI[1].red.y = (float)(pBVar2->max).x;
    local_84 = local_58.x;
    local_88 = local_58.y;
    Imath_3_2::Vec3<float>::Vec3
              (&local_94,local_58.x / local_58.y,1.0,((1.0 - local_58.x) - local_58.y) / local_58.y)
    ;
    local_98 = local_80.x;
    local_9c = local_80.y;
    Imath_3_2::Vec3<float>::Vec3
              (&local_a8,local_80.x / local_80.y,1.0,((1.0 - local_80.x) - local_80.y) / local_80.y)
    ;
    Imath_3_2::operator*
              ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    Imath_3_2::operator*
              ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    Imath_3_2::Vec3<float>::operator/
              ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    pfVar3 = Imath_3_2::Vec3<float>::operator[](&local_b4,0);
    a = *pfVar3;
    pfVar3 = Imath_3_2::Vec3<float>::operator[](&local_b4,1);
    f = *pfVar3;
    pfVar3 = Imath_3_2::Vec3<float>::operator[](&local_b4,2);
    k = *pfVar3;
    Y = 0.0;
    uVar4 = 0;
    Imath_3_2::Matrix44<float>::Matrix44
              (&local_10c,a,0.0,0.0,0.0,0.0,f,0.0,0.0,0.0,0.0,k,0.0,0.0,0.0,0.0,1.0);
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd2c,k),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd24,uVar4));
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd2c,k),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd24,uVar4));
    RGBtoXYZ(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd2c,k),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd24,uVar4));
    XYZtoRGB(in_RDI,Y);
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd2c,k),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffd24,uVar4));
    Imath_3_2::Matrix44<float>::operator=((Matrix44<float> *)&in_RDI[1].green.y,local_1cc);
  }
  return;
}

Assistant:

void
AcesInputFile::Data::initColorConversion ()
{
    const Header& header = rgbaFile->header ();

    Chromaticities fileChr;

    if (hasChromaticities (header)) fileChr = chromaticities (header);

    V2f fileNeutral = fileChr.white;

    if (hasAdoptedNeutral (header))
    {
        fileNeutral   = adoptedNeutral (header);
        fileChr.white = fileNeutral; // for RGBtoXYZ() purposes.
    }

    const Chromaticities acesChr = acesChromaticities ();

    V2f acesNeutral = acesChr.white;

    if (fileChr.red == acesChr.red && fileChr.green == acesChr.green &&
        fileChr.blue == acesChr.blue && fileChr.white == acesChr.white)
    {
        //
        // The file already contains ACES data,
        // color conversion is not necessary.

        return;
    }

    mustConvertColor = true;
    minX             = header.dataWindow ().min.x;
    maxX             = header.dataWindow ().max.x;

    //
    // Create a matrix that transforms colors from the
    // RGB space of the input file into the ACES space
    // using a color adaptation transform to move the
    // white point.
    //

    //
    // We'll need the Bradford cone primary matrix and its inverse
    //

    static const M44f bradfordCPM (
        0.895100f,
        -0.750200f,
        0.038900f,
        0.000000f,
        0.266400f,
        1.713500f,
        -0.068500f,
        0.000000f,
        -0.161400f,
        0.036700f,
        1.029600f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    const static M44f inverseBradfordCPM (
        0.986993f,
        0.432305f,
        -0.008529f,
        0.000000f,
        -0.147054f,
        0.518360f,
        0.040043f,
        0.000000f,
        0.159963f,
        0.049291f,
        0.968487f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    //
    // Convert the white points of the two RGB spaces to XYZ
    //

    float fx = fileNeutral.x;
    float fy = fileNeutral.y;
    V3f   fileNeutralXYZ (fx / fy, 1, (1 - fx - fy) / fy);

    float ax = acesNeutral.x;
    float ay = acesNeutral.y;
    V3f   acesNeutralXYZ (ax / ay, 1, (1 - ax - ay) / ay);

    //
    // Compute the Bradford transformation matrix
    //

    V3f ratio ((acesNeutralXYZ * bradfordCPM) / (fileNeutralXYZ * bradfordCPM));

    M44f ratioMat (
        ratio[0], 0, 0, 0, 0, ratio[1], 0, 0, 0, 0, ratio[2], 0, 0, 0, 0, 1);

    M44f bradfordTrans = bradfordCPM * ratioMat * inverseBradfordCPM;

    //
    // Build a combined file-RGB-to-ACES-RGB conversion matrix
    //

    fileToAces = RGBtoXYZ (fileChr, 1) * bradfordTrans * XYZtoRGB (acesChr, 1);
}